

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConfigLiblistSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConfigLiblistSyntax,slang::parsing::Token,slang::syntax::TokenList&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Info *pIVar1;
  SyntaxNode *pSVar2;
  size_t sVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  ConfigLiblistSyntax *pCVar9;
  
  pCVar9 = (ConfigLiblistSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConfigLiblistSyntax *)this->endPtr < pCVar9 + 1) {
    pCVar9 = (ConfigLiblistSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar9 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  (pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind = ConfigLiblist;
  (pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar9->liblist).kind = TVar4;
  (pCVar9->liblist).field_0x2 = uVar5;
  (pCVar9->liblist).numFlags = (NumericTokenFlags)NVar6.raw;
  (pCVar9->liblist).rawLen = uVar7;
  (pCVar9->liblist).info = pIVar1;
  uVar8 = *(undefined4 *)&(args_1->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (args_1->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.kind =
       (args_1->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar8;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args_1->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar9->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0062ede0;
  (pCVar9->libraries).super_SyntaxListBase.childCount = (args_1->super_SyntaxListBase).childCount;
  sVar3 = (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (pCVar9->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args_1->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (pCVar9->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pCVar9->libraries).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0062ed20;
  (pCVar9->libraries).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)pCVar9;
  return pCVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }